

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

word If_CluDeriveNonDisjoint(word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g,If_Grp_t *r)

{
  size_t __n;
  byte bVar1;
  word wVar2;
  word wVar3;
  ulong uVar4;
  int *V2P_00;
  int *V2P_01;
  int iVar;
  int nWords;
  uint uVar5;
  uint uVar6;
  word pCofs [2] [1024];
  ulong local_4038 [1024];
  word local_2038 [1025];
  
  uVar6 = nVars - g->nVars;
  iVar = nVars + -1;
  If_CluCofactors(pF,nVars,iVar,local_4038,local_2038);
  g->nVars = g->nVars + -1;
  wVar2 = If_CluDeriveDisjoint(local_4038,iVar,V2P_00,P2V,g,(If_Grp_t *)0x0);
  wVar3 = If_CluDeriveDisjoint(local_2038,iVar,V2P_01,P2V,g,(If_Grp_t *)0x0);
  bVar1 = g->nVars;
  g->nVars = bVar1 + 1;
  if ((int)uVar6 < 5) {
    *pF = local_2038[0] << ((byte)(1 << ((char)uVar6 + 1U & 0x1f)) & 0x3f) | local_4038[0];
  }
  else if (uVar6 - 5 != 0x1f) {
    uVar5 = 1 << ((byte)(uVar6 - 5) & 0x1f);
    __n = (ulong)uVar5 * 8;
    memcpy(pF,local_4038,__n);
    memcpy(pF + (int)uVar5,local_2038,__n);
  }
  r->nVars = (char)uVar6 + '\x02';
  r->nMyu = '\0';
  if (0 < (int)uVar6) {
    uVar4 = 0;
    do {
      r->pVars[uVar4] = (char)P2V[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  r->pVars[(int)uVar6] = (char)nVars;
  r->pVars[(long)(int)uVar6 + 1] = g->pVars[(long)g->nVars + -1];
  return wVar3 << ((byte)(1L << (bVar1 & 0x3f)) & 0x3f) | wVar2;
}

Assistant:

word If_CluDeriveNonDisjoint( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g, If_Grp_t * r )
{
    word pCofs[2][CLU_WRD_MAX];
    word Truth0, Truth1, Truth;
    int i, nFSset = nVars - g->nVars, nFSset1 = nFSset + 1;
    If_CluCofactors( pF, nVars, nVars - 1, pCofs[0], pCofs[1] );

//    Extra_PrintHex( stdout, (unsigned *)pCofs[0], nVars ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)pCofs[1], nVars ); printf( "\n" );

    g->nVars--;
    Truth0 = If_CluDeriveDisjoint( pCofs[0], nVars - 1, V2P, P2V, g, NULL );
    Truth1 = If_CluDeriveDisjoint( pCofs[1], nVars - 1, V2P, P2V, g, NULL );
    Truth  = (Truth1 << (1 << g->nVars)) | Truth0;
    g->nVars++;
    if ( nFSset1 < 6 )
        pF[0] = (pCofs[1][0] << (1 << nFSset1)) | pCofs[0][0];
    else
    {
        If_CluCopy( pF, pCofs[0], nFSset1 );
        If_CluCopy( pF + If_CluWordNum(nFSset1), pCofs[1], nFSset1 );
    }

//    Extra_PrintHex( stdout, (unsigned *)&Truth0, 6 ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)&Truth1, 6 ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)&pCofs[0][0], 6 ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)&pCofs[1][0], 6 ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)&Truth, 6 ); printf( "\n" );
//    Extra_PrintHex( stdout, (unsigned *)&pF[0], 6 ); printf( "\n" );

    // create the resulting group
    r->nVars = nFSset + 2;
    r->nMyu = 0;
    for ( i = 0; i < nFSset; i++ )
        r->pVars[i] = P2V[i];
    r->pVars[nFSset] = nVars;
    r->pVars[nFSset+1] = g->pVars[g->nVars - 1];
    return Truth;
}